

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

uint nk_decompress(uchar *output,uchar *i,uint length)

{
  uint buflen;
  uint uVar1;
  uchar *puVar2;
  uchar *old_i;
  uint olen;
  uint length_local;
  uchar *i_local;
  uchar *output_local;
  
  if (((uint)*i * 0x1000000 + (uint)i[1] * 0x10000 + (uint)i[2] * 0x100 + (uint)i[3] == 0x57bc0000)
     && ((uint)i[4] * 0x1000000 + (uint)i[5] * 0x10000 + (uint)i[6] * 0x100 + (uint)i[7] == 0)) {
    buflen = nk_decompress_length(i);
    nk__barrier3 = i + length;
    nk__barrier = output + buflen;
    nk__barrier2 = i;
    nk__barrier4 = output;
    nk__dout = output;
    _olen = i + 0x10;
    do {
      puVar2 = nk_decompress_token(_olen);
      if (puVar2 == _olen) {
        if ((*puVar2 != '\x05') || (puVar2[1] != 0xfa)) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                        ,0x33e7,
                        "unsigned int nk_decompress(unsigned char *, unsigned char *, unsigned int)"
                       );
        }
        if (nk__dout != output + buflen) {
          __assert_fail("nk__dout == output + olen",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                        ,0x33e1,
                        "unsigned int nk_decompress(unsigned char *, unsigned char *, unsigned int)"
                       );
        }
        if (nk__dout == output + buflen) {
          uVar1 = nk_adler32(1,output,buflen);
          if (uVar1 != (uint)puVar2[2] * 0x1000000 +
                       (uint)puVar2[3] * 0x10000 + (uint)puVar2[4] * 0x100 + (uint)puVar2[5]) {
            return 0;
          }
          return buflen;
        }
        return 0;
      }
      if (output + buflen < nk__dout) {
        __assert_fail("nk__dout <= output + olen",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                      ,0x33eb,
                      "unsigned int nk_decompress(unsigned char *, unsigned char *, unsigned int)");
      }
      _olen = puVar2;
    } while (nk__dout <= output + buflen);
  }
  return 0;
}

Assistant:

NK_INTERN unsigned int
nk_decompress(unsigned char *output, unsigned char *i, unsigned int length)
{
    unsigned int olen;
    if (nk__in4(0) != 0x57bC0000) return 0;
    if (nk__in4(4) != 0)          return 0; /* error! stream is > 4GB */
    olen = nk_decompress_length(i);
    nk__barrier2 = i;
    nk__barrier3 = i+length;
    nk__barrier = output + olen;
    nk__barrier4 = output;
    i += 16;

    nk__dout = output;
    for (;;) {
        unsigned char *old_i = i;
        i = nk_decompress_token(i);
        if (i == old_i) {
            if (*i == 0x05 && i[1] == 0xfa) {
                NK_ASSERT(nk__dout == output + olen);
                if (nk__dout != output + olen) return 0;
                if (nk_adler32(1, output, olen) != (unsigned int) nk__in4(2))
                    return 0;
                return olen;
            } else {
                NK_ASSERT(0); /* NOTREACHED */
                return 0;
            }
        }
        NK_ASSERT(nk__dout <= output + olen);
        if (nk__dout > output + olen)
            return 0;
    }
}